

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.c
# Opt level: O1

void sysbvm_error(char *message)

{
  sysbvm_context_t *context;
  sysbvm_tuple_t sVar1;
  
  context = sysbvm_stackFrame_getActiveContext();
  if (context != (sysbvm_context_t *)0x0) {
    sVar1 = sysbvm_string_createWithCString(context,message);
    sVar1 = sysbvm_error_createWithMessageText(context,sVar1);
    sysbvm_exception_signal(context,sVar1);
    return;
  }
  sysbvm_error_cold_1();
  sysbvm_error("Cannot access slot of dummy value.");
  return;
}

Assistant:

SYSBVM_API void sysbvm_error(const char *message)
{
    sysbvm_context_t *activeContext = sysbvm_stackFrame_getActiveContext();
    if(!activeContext)
    {
        fprintf(stderr, "%s\n", message);
        abort();
    }

    sysbvm_tuple_t errorString = sysbvm_string_createWithCString(activeContext, message);
    sysbvm_tuple_t errorException = sysbvm_error_createWithMessageText(activeContext, errorString);
    sysbvm_exception_signal(activeContext, errorException);
}